

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_188c2::verifyPixelsAreEqual<half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  half *phVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  ImageLevel *pIVar5;
  TypedDeepImageChannel<half> *this;
  TypedDeepImageChannel<half> *this_00;
  DeepImageLevel *pDVar6;
  DeepImageLevel *pDVar7;
  uint *puVar8;
  half *phVar9;
  half *phVar10;
  ArgExc *this_01;
  ulong uVar11;
  char *pcVar12;
  int x;
  int y;
  
  this = (TypedDeepImageChannel<half> *)
         __dynamic_cast(c1,&Imf_2_5::DeepImageChannel::typeinfo,
                        &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if ((this == (TypedDeepImageChannel<half> *)0x0) ||
     (this_00 = (TypedDeepImageChannel<half> *)
                __dynamic_cast(c2,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0),
     this_00 == (TypedDeepImageChannel<half> *)0x0)) {
    __cxa_bad_cast();
  }
  pIVar5 = (c1->super_ImageChannel)._level;
  pDVar6 = Imf_2_5::DeepImageChannel::deepLevel(c1);
  pDVar7 = Imf_2_5::DeepImageChannel::deepLevel(c2);
  y = (pIVar5->_dataWindow).min.y;
  do {
    if ((pIVar5->_dataWindow).max.y < y) {
      return;
    }
    for (x = (pIVar5->_dataWindow).min.x; x <= (pIVar5->_dataWindow).max.x; x = x + 1) {
      puVar8 = Imf_2_5::SampleCountChannel::at(&pDVar6->_sampleCounts,x,y);
      uVar4 = *puVar8;
      puVar8 = Imf_2_5::SampleCountChannel::at(&pDVar7->_sampleCounts,x + dx,y + dy);
      if (uVar4 != *puVar8) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar12 = "different pixel sample counts";
LAB_00112de9:
        Iex_2_5::ArgExc::ArgExc(this_01,pcVar12);
        __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      phVar9 = Imf_2_5::TypedDeepImageChannel<half>::at(this,x,y);
      phVar10 = Imf_2_5::TypedDeepImageChannel<half>::at(this_00,x + dx,y + dy);
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      uVar11 = 0;
      while (uVar4 != uVar11) {
        fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar9[uVar11]._h * 4);
        phVar1 = phVar10 + uVar11;
        uVar11 = uVar11 + 1;
        pfVar2 = (float *)((long)&half::_toFloat + (ulong)phVar1->_h * 4);
        if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
          this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
          pcVar12 = "different sample values";
          goto LAB_00112de9;
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

void
verifyPixelsAreEqual
    (const DeepImageChannel &c1,
     const DeepImageChannel &c2,
     int dx,
     int dy)
{
    const TypedDeepImageChannel<T> &tc1 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T> &tc2 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    const SampleCountChannel &scc1 = c1.deepLevel().sampleCounts();
    const SampleCountChannel &scc2 = c2.deepLevel().sampleCounts();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2)
                throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i])
                    throw ArgExc ("different sample values");
        }
    }
}